

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void random_group_element_test(secp256k1_ge *ge)

{
  int iVar1;
  secp256k1_fe *in_RDI;
  secp256k1_fe fe;
  secp256k1_fe *x;
  secp256k1_ge *in_stack_ffffffffffffffd0;
  secp256k1_fe *in_stack_ffffffffffffffe0;
  
  do {
    random_fe_test(in_stack_ffffffffffffffe0);
    x = in_RDI;
    secp256k1_testrand_bits((int)((ulong)in_RDI >> 0x20));
    iVar1 = secp256k1_ge_set_xo_var(in_stack_ffffffffffffffd0,x,0);
  } while (iVar1 == 0);
  secp256k1_fe_impl_normalize(in_RDI + 1);
  *(undefined4 *)in_RDI[2].n = 0;
  return;
}

Assistant:

static void random_group_element_test(secp256k1_ge *ge) {
    secp256k1_fe fe;
    do {
        random_fe_test(&fe);
        if (secp256k1_ge_set_xo_var(ge, &fe, secp256k1_testrand_bits(1))) {
            secp256k1_fe_normalize(&ge->y);
            break;
        }
    } while(1);
    ge->infinity = 0;
}